

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_aes_cbc_hmac_sha256_hw.c
# Opt level: O0

int aesni_cbc_hmac_sha256_init_key(EVP_CIPHER_CTX *ctx,uchar *inkey,uchar *iv,int enc)

{
  int iVar1;
  void *pvVar2;
  int in_ECX;
  undefined8 in_RSI;
  EVP_CIPHER_CTX *in_RDI;
  int ret;
  EVP_AES_HMAC_SHA256 *key;
  EVP_CIPHER_CTX *in_stack_00000050;
  int local_2c;
  
  pvVar2 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  if (in_ECX == 0) {
    iVar1 = EVP_CIPHER_CTX_get_key_length(in_stack_00000050);
    local_2c = aesni_set_decrypt_key(in_RSI,iVar1 << 3,pvVar2);
  }
  else {
    iVar1 = EVP_CIPHER_CTX_get_key_length(in_stack_00000050);
    local_2c = aesni_set_encrypt_key(in_RSI,iVar1 << 3,pvVar2);
  }
  SHA256_Init((SHA256_CTX *)((long)pvVar2 + 0xf4));
  memcpy((void *)((long)pvVar2 + 0x164),(void *)((long)pvVar2 + 0xf4),0x70);
  memcpy((void *)((long)pvVar2 + 0x1d4),(void *)((long)pvVar2 + 0xf4),0x70);
  *(undefined8 *)((long)pvVar2 + 0x248) = 0xffffffffffffffff;
  return (uint)(-1 < local_2c);
}

Assistant:

static int aesni_cbc_hmac_sha256_init_key(PROV_CIPHER_CTX *vctx,
                                          const unsigned char *key,
                                          size_t keylen)
{
    int ret;
    PROV_AES_HMAC_SHA_CTX *ctx = (PROV_AES_HMAC_SHA_CTX *)vctx;
    PROV_AES_HMAC_SHA256_CTX *sctx = (PROV_AES_HMAC_SHA256_CTX *)vctx;

    if (ctx->base.enc)
        ret = aesni_set_encrypt_key(key, ctx->base.keylen * 8, &ctx->ks);
    else
        ret = aesni_set_decrypt_key(key, ctx->base.keylen * 8, &ctx->ks);

    SHA256_Init(&sctx->head);    /* handy when benchmarking */
    sctx->tail = sctx->head;
    sctx->md = sctx->head;

    ctx->payload_length = NO_PAYLOAD_LENGTH;

    vctx->removetlspad = 1;
    vctx->removetlsfixed = SHA256_DIGEST_LENGTH + AES_BLOCK_SIZE;

    return ret < 0 ? 0 : 1;
}